

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O2

bool __thiscall crunch::convert(crunch *this,char *pCommand_line)

{
  command_line_params *this_00;
  bool bVar1;
  uint uVar2;
  pixel_format fmt;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  uint32 i;
  uint index;
  ulong uVar5;
  char *pcVar6;
  console *this_01;
  _Base_ptr p_Var7;
  long lVar8;
  dynamic_string log_filename;
  vector<crnlib::command_line_params::param_desc> params;
  param_desc std_params [64];
  
  this->m_num_processed = 0;
  this->m_num_failed = 0;
  this->m_num_succeeded = 0;
  this->m_num_skipped = 0;
  memcpy(std_params,&DAT_001b8fc0,0x400);
  params.m_p = (param_desc *)0x0;
  params.m_size = 0;
  params.m_capacity = 0;
  crnlib::vector<crnlib::command_line_params::param_desc>::append(&params,std_params,0x40);
  index = 0;
  while( true ) {
    uVar2 = crnlib::pixel_format_helpers::get_num_formats();
    if (uVar2 <= index) break;
    fmt = crnlib::pixel_format_helpers::get_pixel_format_by_index(index);
    log_filename._0_8_ = crnlib::pixel_format_helpers::get_pixel_format_string(fmt);
    log_filename.m_pStr = (char *)((ulong)log_filename.m_pStr & 0xffffff0000000000);
    crnlib::vector<crnlib::command_line_params::param_desc>::push_back
              (&params,(param_desc *)&log_filename);
    index = index + 1;
  }
  this_00 = &this->m_params;
  bVar1 = crnlib::command_line_params::parse(this_00,pCommand_line,params.m_size,params.m_p,true);
  if (bVar1) {
    if ((int)(this->m_params).m_param_map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      bVar1 = crnlib::command_line_params::get_value_as_bool(this_00,"debug",0,false);
      if (bVar1) {
        pcVar6 = "Command line parameters:";
        crnlib::console::debug("Command line parameters:");
        p_Var7 = (this->m_params).m_param_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while ((_Rb_tree_header *)p_Var7 !=
               &(this->m_params).m_param_map._M_t._M_impl.super__Rb_tree_header) {
          crnlib::console::disable_crlf((console *)pcVar6);
          pcVar6 = (char *)p_Var7[1]._M_parent;
          if ((_Base_ptr)pcVar6 == (_Base_ptr)0x0) {
            pcVar6 = "";
          }
          crnlib::console::debug
                    ("Key:\"%s\" Values (%u): ",pcVar6,(ulong)*(uint *)&p_Var7[1]._M_right);
          lVar8 = 8;
          for (uVar5 = 0; uVar5 < *(uint *)&p_Var7[1]._M_right; uVar5 = uVar5 + 1) {
            pcVar6 = *(char **)((long)&(p_Var7[1]._M_left)->_M_color + lVar8);
            if (pcVar6 == (char *)0x0) {
              pcVar6 = "";
            }
            crnlib::console::debug("\"%s\" ",pcVar6);
            lVar8 = lVar8 + 0x10;
          }
          this_01 = (console *)0x18679b;
          crnlib::console::debug("\n");
          crnlib::console::enable_crlf(this_01);
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          pcVar6 = (char *)p_Var7;
          p_Var7 = p_Var4;
        }
      }
      log_filename._0_8_ = log_filename._0_8_ & 0xffffffff00000000;
      log_filename.m_pStr = (char *)0x0;
      iVar3 = 0x185b6c;
      bVar1 = crnlib::command_line_params::get_value_as_string(this_00,"logfile",0,&log_filename,0);
      if (bVar1) {
        pcVar6 = log_filename.m_pStr;
        if (log_filename.m_pStr == (char *)0x0) {
          pcVar6 = "";
        }
        iVar3 = crnlib::cfile_stream::open(&this->m_log_stream,pcVar6,6,1);
        pcVar6 = "";
        if (log_filename.m_pStr != (char *)0x0) {
          pcVar6 = log_filename.m_pStr;
        }
        if ((char)iVar3 != '\0') {
          crnlib::console::printf("Appending output to log file \"%s\"");
          iVar3 = (int)pcVar6;
          crnlib::console::m_pLog_stream = this;
          goto LAB_00108a01;
        }
        bVar1 = false;
        crnlib::console::error("Unable to open log file: \"%s\"",pcVar6);
      }
      else {
LAB_00108a01:
        bVar1 = convert(this);
        if (((this->m_log_stream).super_data_stream.field_0x1a & 1) != 0) {
          crnlib::console::m_pLog_stream = (crunch *)0x0;
          crnlib::cfile_stream::close(&this->m_log_stream,iVar3);
        }
      }
      crnlib::dynamic_string::~dynamic_string(&log_filename);
      goto LAB_00108a5e;
    }
    crnlib::console::error("No command line parameters specified!");
    print_usage();
  }
  bVar1 = false;
LAB_00108a5e:
  crnlib::vector<crnlib::command_line_params::param_desc>::~vector(&params);
  return bVar1;
}

Assistant:

bool convert(const char* pCommand_line)
    {
        m_num_processed = 0;
        m_num_failed = 0;
        m_num_succeeded = 0;
        m_num_skipped = 0;

        command_line_params::param_desc std_params[] =
        {
            { "file", 1, true },

            { "out", 1, false },
            { "outdir", 1, false },
            { "outsamedir", 0, false },
            { "deep", 0, false },
            { "fileformat", 1, false },

            { "helperThreads", 1, false },
            { "noprogress", 0, false },
            { "quiet", 0, false },
            { "ignoreerrors", 0, false },
            { "logfile", 1, false },

            { "q", 1, false },
            { "quality", 1, false },

            { "c", 1, false },
            { "s", 1, false },
            { "ca", 1, false },
            { "sa", 1, false },

            { "mipMode", 1, false },
            { "mipFilter", 1, false },
            { "gamma", 1, false },
            { "blurriness", 1, false },
            { "wrap", 0, false },
            { "renormalize", 0, false },
            { "rtopmip", 0, false },
            { "noprogress", 0, false },
            { "paramdebug", 0, false },
            { "debug", 0, false },
            { "quick", 0, false },
            { "imagestats", 0, false },
            { "nostats", 0, false },
            { "mipstats", 0, false },

            { "alphaThreshold", 1, false },
            { "uniformMetrics", 0, false },
            { "noAdaptiveBlocks", 0, false },
            { "compressor", 1, false },
            { "dxtQuality", 1, false },
            { "noendpointcaching", 0, false },
            { "grayscalesampling", 0, false },
            { "converttoluma", 0, false },
            { "setalphatoluma", 0, false },
            { "pause", 0, false },
            { "timestamp", 0, false },
            { "nooverwrite", 0, false },
            { "forcewrite", 0, false },
            { "recreate", 0, false },
            { "compare", 0, false },
            { "info", 0, false },
            { "forceprimaryencoding", 0, false },
            { "usetransparentindicesforblack", 0, false },
            { "usesourceformat", 0, false },

            { "rescalemode", 1, false },
            { "rescale", 2, false },
            { "relrescale", 2, false },
            { "clamp", 2, false },
            { "clampScale", 2, false },
            { "window", 4, false },

            { "maxmips", 1, false },
            { "minmipsize", 1, false },

            { "bitrate", 1, false },

            { "lzmastats", 0, false },
            { "split", 0, false },
            { "csvfile", 1, false },

            { "yflip", 0, false },
            { "unflip", 0, false },
        };

        crnlib::vector<command_line_params::param_desc> params;
        params.append(std_params, sizeof(std_params) / sizeof(std_params[0]));

        for (uint32 i = 0; i < pixel_format_helpers::get_num_formats(); i++)
        {
            pixel_format fmt = pixel_format_helpers::get_pixel_format_by_index(i);

            command_line_params::param_desc desc;
            desc.m_pName = pixel_format_helpers::get_pixel_format_string(fmt);
            desc.m_num_values = 0;
            desc.m_support_listing_file = false;
            params.push_back(desc);
        }

        if (!m_params.parse(pCommand_line, params.size(), params.get_ptr(), true))
        {
            return false;
        }

        if (!m_params.get_num_params())
        {
            console::error("No command line parameters specified!");

            print_usage();

            return false;
        }

#if 0
        if (m_params.get_count(""))
        {
            console::error("Unrecognized command line parameter: \"%s\"", m_params.get_value_as_string_or_empty("", 0).get_ptr());

            return false;
        }
#endif

        if (m_params.get_value_as_bool("debug"))
        {
            console::debug("Command line parameters:");
            for (command_line_params::param_map_const_iterator it = m_params.begin(); it != m_params.end(); ++it)
            {
                console::disable_crlf();
                console::debug("Key:\"%s\" Values (%u): ", it->first.get_ptr(), it->second.m_values.size());
                for (uint32 i = 0; i < it->second.m_values.size(); i++)
                {
                    console::debug("\"%s\" ", it->second.m_values[i].get_ptr());
                }
                console::debug("\n");
                console::enable_crlf();
            }
        }

        dynamic_string log_filename;
        if (m_params.get_value_as_string("logfile", 0, log_filename))
        {
            if (!m_log_stream.open(log_filename.get_ptr(), cDataStreamWritable | cDataStreamSeekable, true))
            {
                console::error("Unable to open log file: \"%s\"", log_filename.get_ptr());
                return false;
            }

            console::printf("Appending output to log file \"%s\"", log_filename.get_ptr());

            console::set_log_stream(&m_log_stream);
        }

        bool status = convert();

        if (m_log_stream.is_opened())
        {
            console::set_log_stream(nullptr);

            m_log_stream.close();
        }

        return status;
    }